

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O2

R_conflict10 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
             *this,char *first,char *last,char *pat_first,char *pat_last)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  R_conflict10 RVar8;
  R_conflict10 RVar9;
  
  uVar3 = (long)pat_last - (long)pat_first;
  if (uVar3 == 0) {
    RVar9.end = first;
    RVar9.begin = first;
    return RVar9;
  }
  pbVar1 = (byte *)(first + (uVar3 - 1));
  uVar4 = 0;
  if (0 < (long)uVar3) {
    uVar4 = uVar3;
  }
  do {
    pbVar2 = (byte *)last;
    if (last <= pbVar1) {
LAB_00161da1:
      RVar8.end = (char *)pbVar2;
      RVar8.begin = last;
      return RVar8;
    }
    uVar6 = (ulong)(byte)this[""[*pbVar1]];
    if (uVar6 == 0) {
      lVar7 = 0;
      lVar5 = (long)pat_first - (long)pat_last;
      while( true ) {
        if (-lVar7 == uVar4) {
          last = (char *)(pbVar1 + (1 - uVar4));
          pbVar2 = pbVar1 + (uVar3 - uVar4) + 1;
          goto LAB_00161da1;
        }
        if (""[pbVar1[lVar7]] != pat_first[lVar7 + (uVar3 - 1)]) break;
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + -1;
      }
      uVar6 = -lVar5;
      if (uVar3 != (byte)this[""[pbVar1[lVar7]]]) {
        uVar6 = 1;
      }
    }
    pbVar1 = pbVar1 + uVar6;
  } while( true );
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }